

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantoken.cpp
# Opt level: O2

void __thiscall YAML::Scanner::ScanFlowStart(Scanner *this)

{
  int iVar1;
  undefined8 uVar2;
  char cVar3;
  FLOW_MARKER flowType;
  value_type local_7c;
  Token local_78;
  
  InsertPotentialSimpleKey(this);
  this->m_simpleKeyAllowed = true;
  this->m_canBeJSONFlow = false;
  uVar2._0_4_ = (this->INPUT).m_mark.pos;
  uVar2._4_4_ = (this->INPUT).m_mark.line;
  iVar1 = (this->INPUT).m_mark.column;
  cVar3 = YAML::Stream::get(&this->INPUT);
  local_7c = (value_type)(cVar3 == '[');
  std::deque<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>::push_back
            (&(this->m_flows).c,&local_7c);
  local_78.type = local_7c == FLOW_SEQ ^ FLOW_MAP_START;
  local_78.value._M_dataplus._M_p = (pointer)&local_78.value.field_2;
  local_78.status = VALID;
  local_78.value._M_string_length = 0;
  local_78.value.field_2._M_local_buf[0] = '\0';
  local_78.params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_78.params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_78.params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_78._76_8_ = 0;
  local_78.mark._0_8_ = uVar2;
  local_78.mark.column = iVar1;
  std::deque<YAML::Token,_std::allocator<YAML::Token>_>::emplace_back<YAML::Token>
            (&(this->m_tokens).c,&local_78);
  Token::~Token(&local_78);
  return;
}

Assistant:

void Scanner::ScanFlowStart() {
  // flows can be simple keys
  InsertPotentialSimpleKey();
  m_simpleKeyAllowed = true;
  m_canBeJSONFlow = false;

  // eat
  Mark mark = INPUT.mark();
  char ch = INPUT.get();
  FLOW_MARKER flowType = (ch == Keys::FlowSeqStart ? FLOW_SEQ : FLOW_MAP);
  m_flows.push(flowType);
  Token::TYPE type =
      (flowType == FLOW_SEQ ? Token::FLOW_SEQ_START : Token::FLOW_MAP_START);
  m_tokens.push(Token(type, mark));
}